

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O1

void ddb_h2(Integer ndims,Integer *ardims,Integer npes,double threshold,Integer bias,Integer *blk,
           Integer *pedims)

{
  size_t sVar1;
  long lVar2;
  Integer *ardims_00;
  long lVar3;
  void *__ptr;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  size_t __nmemb;
  size_t sVar11;
  long lVar12;
  bool bVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  ardims_00 = (Integer *)calloc(ndims,8);
  if (ardims_00 == (Integer *)0x0) {
    ddb_h2_cold_2();
  }
  else {
    if (0 < ndims) {
      lVar3 = 0;
      do {
        if (blk[lVar3] < 1) {
          blk[lVar3] = 1;
        }
        lVar3 = lVar3 + 1;
      } while (ndims != lVar3);
    }
    if (0 < ndims) {
      lVar3 = 0;
      do {
        ardims_00[lVar3] = (ardims[lVar3] + blk[lVar3] + -1) / blk[lVar3];
        lVar3 = lVar3 + 1;
      } while (ndims != lVar3);
    }
    if (0 < ndims) {
      lVar3 = 0;
      do {
        if (ardims_00[lVar3] < 1) {
          ardims_00[lVar3] = 1;
          blk[lVar3] = ardims[lVar3];
        }
        lVar3 = lVar3 + 1;
      } while (ndims != lVar3);
    }
    __nmemb = 1;
    if (1 < npes) {
      lVar3 = npes + -2;
      auVar15._8_4_ = (int)lVar3;
      auVar15._0_8_ = lVar3;
      auVar15._12_4_ = (int)((ulong)lVar3 >> 0x20);
      uVar8 = 0;
      auVar15 = auVar15 ^ _DAT_001b1490;
      auVar22 = ZEXT416(1);
      do {
        auVar18 = auVar22;
        auVar21._8_4_ = (int)uVar8;
        auVar21._0_8_ = uVar8;
        auVar21._12_4_ = (int)(uVar8 >> 0x20);
        auVar22 = (auVar21 | _DAT_001b14c0) ^ _DAT_001b1490;
        auVar25._0_4_ = -(uint)(auVar15._0_4_ < auVar22._0_4_);
        auVar25._4_4_ = -(uint)(auVar15._4_4_ < auVar22._4_4_);
        auVar25._8_4_ = -(uint)(auVar15._8_4_ < auVar22._8_4_);
        auVar25._12_4_ = -(uint)(auVar15._12_4_ < auVar22._12_4_);
        auVar23._4_4_ = -(uint)(auVar22._4_4_ == auVar15._4_4_);
        auVar23._12_4_ = -(uint)(auVar22._12_4_ == auVar15._12_4_);
        auVar23._0_4_ = auVar23._4_4_;
        auVar23._8_4_ = auVar23._12_4_;
        auVar28._4_4_ = auVar25._4_4_;
        auVar28._0_4_ = auVar25._4_4_;
        auVar28._8_4_ = auVar25._12_4_;
        auVar28._12_4_ = auVar25._12_4_;
        auVar28 = auVar23 & auVar25 | auVar28;
        auVar26 = auVar18;
        if ((~auVar28._0_4_ & 1) != 0) {
          auVar26._8_8_ = 0;
          auVar26._0_8_ = (ulong)npes % (uVar8 + 2);
        }
        if (((auVar28._8_2_ ^ 0xffff) & 1) != 0) {
          auVar26._8_8_ = (ulong)npes % (uVar8 + 3);
        }
        auVar27._0_4_ = -(uint)(auVar26._0_4_ == 0);
        auVar27._4_4_ = -(uint)(auVar26._4_4_ == 0);
        auVar27._8_4_ = -(uint)(auVar26._8_4_ == 0);
        auVar27._12_4_ = -(uint)(auVar26._12_4_ == 0);
        auVar29._4_4_ = auVar27._0_4_;
        auVar29._0_4_ = auVar27._4_4_;
        auVar29._8_4_ = auVar27._12_4_;
        auVar29._12_4_ = auVar27._8_4_;
        auVar22._0_8_ = auVar18._0_8_ - SUB168(auVar29 & auVar27,0);
        auVar22._8_8_ = auVar18._8_8_ - SUB168(auVar29 & auVar27,8);
        uVar8 = uVar8 + 2;
      } while ((npes & 0x7ffffffffffffffeU) != uVar8);
      auVar16._4_4_ = auVar25._0_4_;
      auVar16._0_4_ = auVar25._0_4_;
      auVar16._8_4_ = auVar25._8_4_;
      auVar16._12_4_ = auVar25._8_4_;
      auVar24._4_4_ = auVar25._4_4_;
      auVar24._0_4_ = auVar25._4_4_;
      auVar24._8_4_ = auVar25._12_4_;
      auVar24._12_4_ = auVar25._12_4_;
      auVar24 = auVar23 & auVar16 | auVar24;
      auVar22 = ~auVar24 & auVar22 | auVar18 & auVar24;
      __nmemb = auVar22._8_8_ + auVar22._0_8_;
    }
    __ptr = calloc(__nmemb,8);
    if (__ptr != (void *)0x0) {
      if (0 < npes) {
        lVar3 = 0;
        uVar8 = 1;
        do {
          if ((ulong)npes % uVar8 == 0) {
            *(ulong *)((long)__ptr + lVar3 * 8) = uVar8;
            lVar3 = lVar3 + 1;
          }
          bVar13 = uVar8 != npes;
          uVar8 = uVar8 + 1;
        } while (bVar13);
      }
      if (1 < __nmemb) {
        sVar4 = 1;
        sVar11 = __nmemb;
        do {
          sVar1 = sVar4 + 1;
          __nmemb = sVar1;
          for (sVar9 = sVar1; (long)sVar9 < (long)sVar11; sVar9 = sVar9 + 1) {
            lVar3 = *(long *)((long)__ptr + sVar9 * 8);
            lVar6 = *(long *)((long)__ptr + sVar4 * 8);
            if (lVar3 % lVar6 == 0) {
              *(long *)((long)__ptr + __nmemb * 8) = lVar3 / lVar6;
              __nmemb = __nmemb + 1;
            }
          }
          sVar4 = sVar1;
          sVar11 = __nmemb;
        } while ((long)sVar1 < (long)__nmemb);
      }
      auVar22 = _DAT_001b1490;
      lVar3 = ndims + -1;
      lVar6 = 0;
      if (0 < bias) {
        lVar6 = lVar3;
      }
      if (0 < ndims) {
        auVar17._8_4_ = (int)lVar3;
        auVar17._0_8_ = lVar3;
        auVar17._12_4_ = (int)((ulong)lVar3 >> 0x20);
        uVar8 = 0;
        auVar17 = auVar17 ^ _DAT_001b1490;
        auVar18 = _DAT_001b14c0;
        do {
          auVar15 = auVar18 ^ auVar22;
          if ((bool)(~(auVar15._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar15._0_4_ ||
                      auVar17._4_4_ < auVar15._4_4_) & 1)) {
            pedims[uVar8] = 1;
          }
          if ((auVar15._12_4_ != auVar17._12_4_ || auVar15._8_4_ <= auVar17._8_4_) &&
              auVar15._12_4_ <= auVar17._12_4_) {
            pedims[uVar8 + 1] = 1;
          }
          uVar8 = uVar8 + 2;
          lVar3 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 2;
          auVar18._8_8_ = lVar3 + 2;
        } while ((ndims + 1U & 0xfffffffffffffffe) != uVar8);
      }
      if (1 < (long)__nmemb) {
        do {
          lVar3 = *(long *)((long)__ptr + __nmemb * 8 + -8);
          lVar5 = ardims_00[lVar6];
          auVar19 = ZEXT816(0x3ff199999999999a);
          if (pedims[lVar6] * lVar3 <= lVar5) {
            auVar19._0_8_ = (double)(lVar5 % (pedims[lVar6] * lVar3)) / (double)lVar5;
            auVar19._8_8_ = 0;
          }
          lVar5 = lVar6;
          if (1 < ndims) {
            lVar12 = 1;
            lVar7 = -1;
            lVar10 = lVar6;
            do {
              lVar5 = lVar12;
              if (0 < bias) {
                lVar5 = lVar7;
              }
              lVar5 = (lVar5 + lVar6) % ndims;
              lVar2 = ardims_00[lVar5];
              auVar20 = ZEXT816(0x3ff199999999999a);
              if (pedims[lVar5] * lVar3 <= lVar2) {
                auVar20._0_8_ = (double)(lVar2 % (pedims[lVar5] * lVar3)) / (double)lVar2;
                auVar20._8_8_ = 0;
              }
              dVar14 = auVar19._0_8_;
              auVar19 = auVar20;
              if (dVar14 <= auVar20._0_8_) {
                auVar19._8_8_ = auVar20._8_8_;
                auVar19._0_8_ = dVar14;
                lVar5 = lVar10;
              }
              lVar12 = lVar12 + 1;
              lVar7 = lVar7 + -1;
              lVar10 = lVar5;
            } while (ndims != lVar12);
          }
          pedims[lVar5] = lVar3 * pedims[lVar5];
          if (bias == 0) {
            lVar6 = (lVar6 + 1) % ndims;
          }
          bVar13 = 2 < (long)__nmemb;
          __nmemb = __nmemb - 1;
        } while (bVar13);
      }
      free(__ptr);
      dVar14 = 1.0;
      if (0 < ndims) {
        lVar3 = 0;
        do {
          lVar6 = ardims_00[lVar3];
          dVar14 = dVar14 * ((double)(lVar6 - lVar6 % pedims[lVar3]) / (double)lVar6);
          lVar3 = lVar3 + 1;
        } while (ndims != lVar3);
      }
      if (dVar14 < threshold) {
        ddb_ex(ndims,ardims_00,npes,threshold,blk,pedims);
      }
      if (0 < ndims) {
        lVar3 = 0;
        do {
          lVar6 = ardims[lVar3] / pedims[lVar3];
          if (lVar6 < 2) {
            lVar6 = 1;
          }
          blk[lVar3] = lVar6;
          lVar3 = lVar3 + 1;
        } while (ndims != lVar3);
      }
      if (0 < ndims) {
        lVar3 = 0;
        do {
          lVar6 = pedims[lVar3];
          if (lVar6 < 1) {
            pnga_error("process dimension is zero: ddb_h2",0);
          }
          else {
            blk[lVar3] = (ardims_00[lVar3] + lVar6 + -1) / lVar6;
          }
          lVar3 = lVar3 + 1;
        } while (ndims != lVar3);
      }
      free(ardims_00);
      return;
    }
    ddb_h2_cold_1();
  }
  return;
}

Assistant:

void ddb_h2(Integer ndims, Integer ardims[], Integer npes, double threshold, Integer bias,
            Integer blk[], Integer pedims[])
      {
      long h, i, j, k;
      Integer *tard;
      long * pdivs;
      long npdivs;
      long p0;
      double q, w;
      double ub;
      long istart, istep, ilook;

      /*- Allocate memory to store the granularity -*/
      tard = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(tard==NULL){
         fprintf(stderr,"%s: %s\n","ddb_h2",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         return;
      }
      /*- Reset array dimensions to reflect granularity -*/
      for(i=0;i<ndims;i++) if (blk[i]<1) blk[i] = 1;

      for(i=0;i<ndims;i++) tard[i] = (ardims[i]+ blk[i]-1)/blk[i]; /* JM */
      for(i=0;i<ndims;i++) if (tard[i]<1) {
         tard[i] = 1; blk[i] = ardims[i];
      }

      /*- Allocate storage to old all divisors of npes -*/
      npdivs = 1;
      for(i=2;i<=npes;i++) if(npes%i==0) npdivs += 1;
      pdivs = (long *) calloc((size_t)npdivs,sizeof(long));
      if(pdivs==NULL){
         fprintf(stderr,"%s: %s\n","split",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         return;
      }
      /*- Find all divisors of npes -*/
      for(j=0,i=1;i<=npes;i++) if(npes%i==0) pdivs[j++] = i;

      /*- Find all prime divisors of npes (with repetitions) -*/
      if(npdivs>1) {
         k = 1;
         do {
            h = k+1;
            for(j=h;j<npdivs;j++)
            if(pdivs[j]%pdivs[k]==0)
               pdivs[h++] = pdivs[j]/pdivs[k];
            npdivs = h;
            k = k+1;
         } while(k<npdivs);
      }

      /*- Set istart and istep -*/
      istep = 1;
      istart = 0;
      if(bias>0) {
          istep = -1;
          istart = ndims-1;
      }
      /*- Set pedims -*/
      for(j=0;j<ndims;j++) pedims[j] = 1.0;
      for(k=npdivs-1;k>=1;k--){
         p0 = pdivs[k]; h = istart;
         q = (tard[istart]<p0*pedims[istart]) ? 1.1 :
             (tard[istart]%(p0*pedims[istart]))/(double) tard[istart];
         for(j=1;j<ndims;j++){
            ilook = (istart+istep*j)%ndims;
            w = (tard[ilook]<p0*pedims[ilook]) ? 1.1 :
                (tard[ilook]%(p0*pedims[ilook]))/(double) tard[ilook];
            if(w<q) { q = w; h = ilook; }
         }
         pedims[h] *= p0;
         if(bias==0) istart = (istart+1)%ndims;
      }
      free(pdivs);

      ub = dd_ev(ndims,tard,pedims);

      /*- Do an exhaustive search is the heuristic returns a solution 
       *- whose load balance ratio is less than the given threshold. -*/
      if(ub<threshold) {
         ddb_ex(ndims, tard, npes, threshold, blk, pedims);
      }

      dd_su(ndims,ardims,pedims,blk);

      for(i=0;i<ndims;i++)
          if(pedims[i]>0){
             blk[i] = (tard[i]+pedims[i]-1)/pedims[i];
          } else {
             pnga_error("process dimension is zero: ddb_h2",0);
          }

      free(tard);
      return;
      }